

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O3

void init_for_keyhandle(void)

{
  CURSORDESTHEIGHT68k = MakeAtom68k("\\CURSORDESTHEIGHT");
  CURSORDESTWIDTH68k = MakeAtom68k("\\CURSORDESTWIDTH");
  CURSORHOTSPOTX68k = MakeAtom68k("\\CURSORHOTSPOTX");
  CURSORHOTSPOTY68k = MakeAtom68k("\\CURSORHOTSPOTY");
  SOFTCURSORUPP68k = MakeAtom68k("\\SOFTCURSORUPP");
  SOFTCURSORWIDTH68k = MakeAtom68k("\\SOFTCURSORWIDTH");
  SOFTCURSORHEIGHT68k = MakeAtom68k("\\SOFTCURSORHEIGHT");
  CURRENTCURSOR68k = MakeAtom68k("\\CURRENTCURSOR");
  ATOM_STARTED = MAKEATOM("STARTED");
  KEYBOARDEVENTQUEUE68k = MakeAtom68k("\\KEYBOARDEVENTQUEUE");
  KEYBUFFERING68k = MakeAtom68k("\\KEYBUFFERING");
  PENDINGINTERRUPT68k = MakeAtom68k("\\PENDINGINTERRUPT");
  MOUSECHORDTICKS68k = MakeAtom68k("\\MOUSECHORDTICKS");
  LASTUSERACTION68k = MakeAtom68k("\\LASTUSERACTION");
  DOBUFFEREDTRANSITION_index = MAKEATOM("\\DOBUFFEREDTRANSITIONS");
  INTERRUPTFRAME_index = MAKEATOM("\\INTERRUPTFRAME");
  CTopKeyevent = Lisp_world + *KEYBOARDEVENTQUEUE68k;
  PERIODIC_INTERRUPT68k = MakeAtom68k("\\PERIODIC.INTERRUPT");
  PERIODIC_INTERRUPT_FREQUENCY68k = MakeAtom68k("\\PERIODIC.INTERRUPT.FREQUENCY");
  PERIODIC_INTERRUPTFRAME_index = MAKEATOM("\\PERIODIC.INTERRUPTFRAME");
  DORECLAIM_index = MAKEATOM("\\DORECLAIM");
  return;
}

Assistant:

void init_for_keyhandle(void) {
  DLword index;
  extern DLword *CTopKeyevent;
  extern LispPTR *KEYBOARDEVENTQUEUE68k;
  extern LispPTR *KEYBUFFERING68k;
  extern LispPTR *TIMER_INTERRUPT_PENDING68k;
  extern LispPTR *PENDINGINTERRUPT68k;
  extern LispPTR *MOUSECHORDTICKS68k;
  extern LispPTR *LASTUSERACTION68k;
  extern LispPTR ATOM_STARTED;
  extern LispPTR *CLastUserActionCell68k;

  extern LispPTR *CURSORDESTHEIGHT68k;
  extern LispPTR *CURSORDESTWIDTH68k;

  extern LispPTR *CURSORHOTSPOTX68k;
  extern LispPTR *CURSORHOTSPOTY68k;
  extern LispPTR *SOFTCURSORUPP68k;
  extern LispPTR *SOFTCURSORWIDTH68k;
  extern LispPTR *SOFTCURSORHEIGHT68k;
  extern LispPTR *CURRENTCURSOR68k;

  extern LispPTR *PERIODIC_INTERRUPT68k;
  extern LispPTR *PERIODIC_INTERRUPT_FREQUENCY68k;

  CURSORDESTHEIGHT68k = MakeAtom68k("\\CURSORDESTHEIGHT");
  CURSORDESTWIDTH68k = MakeAtom68k("\\CURSORDESTWIDTH");
  CURSORHOTSPOTX68k = MakeAtom68k("\\CURSORHOTSPOTX");
  CURSORHOTSPOTY68k = MakeAtom68k("\\CURSORHOTSPOTY");

  SOFTCURSORUPP68k = MakeAtom68k("\\SOFTCURSORUPP");
  SOFTCURSORWIDTH68k = MakeAtom68k("\\SOFTCURSORWIDTH");
  SOFTCURSORHEIGHT68k = MakeAtom68k("\\SOFTCURSORHEIGHT");
  CURRENTCURSOR68k = MakeAtom68k("\\CURRENTCURSOR");

  ATOM_STARTED = MAKEATOM("STARTED");

  KEYBOARDEVENTQUEUE68k = MakeAtom68k("\\KEYBOARDEVENTQUEUE");
  KEYBUFFERING68k = MakeAtom68k("\\KEYBUFFERING");

  PENDINGINTERRUPT68k = MakeAtom68k("\\PENDINGINTERRUPT");
  MOUSECHORDTICKS68k = MakeAtom68k("\\MOUSECHORDTICKS");
  LASTUSERACTION68k = MakeAtom68k("\\LASTUSERACTION");

#ifndef INIT
  CLastUserActionCell68k = (LispPTR *)NativeAligned4FromLAddr(*LASTUSERACTION68k & POINTERMASK);
#endif

  DOBUFFEREDTRANSITION_index = MAKEATOM("\\DOBUFFEREDTRANSITIONS");
  INTERRUPTFRAME_index = MAKEATOM("\\INTERRUPTFRAME");

  CTopKeyevent = (DLword *)NativeAligned2FromLAddr(*KEYBOARDEVENTQUEUE68k);

  PERIODIC_INTERRUPT68k = MakeAtom68k("\\PERIODIC.INTERRUPT");
  PERIODIC_INTERRUPT_FREQUENCY68k = MakeAtom68k("\\PERIODIC.INTERRUPT.FREQUENCY");

  PERIODIC_INTERRUPTFRAME_index = MAKEATOM("\\PERIODIC.INTERRUPTFRAME");
  DORECLAIM_index = MAKEATOM("\\DORECLAIM");
#ifndef INIT
  index = get_package_atom("\\MAIKO.IO-INTERRUPT-FLAGS", 25, "INTERLISP", 9, NIL);
  IOINTERRUPTFLAGS_word = GetVALCELL68k(index);
#endif
}